

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

QColor QColorDialog::getColor
                 (QColor *initial,QWidget *parent,QString *title,ColorDialogOptions options)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QColor QVar3;
  QWidget *this;
  long in_FS_OFFSET;
  QAutoPointer<QColorDialog> local_58;
  undefined4 local_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined4 local_38;
  undefined2 uStack_34;
  undefined2 uStack_32;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QWidget *)operator_new(0x28);
  QColorDialog((QColorDialog *)this,parent);
  local_58.o.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  local_58.o.wp.value = (QObject *)this;
  if ((title->d).size != 0) {
    QWidget::setWindowTitle(this,title);
  }
  setOptions((QColorDialog *)local_58.o.wp.value,options);
  QColorDialogPrivate::setCurrentColor
            (*(QColorDialogPrivate **)((long)local_58.o.wp.value + 8),initial,SetColorAll);
  (**(code **)(*(long *)local_58.o.wp.value + 0x1a8))();
  if (((local_58.o.wp.d == (Data *)0x0) || (*(int *)(local_58.o.wp.d + 4) == 0)) ||
     ((QWidget *)local_58.o.wp.value == (QWidget *)0x0)) {
    local_40 = 0;
    uStack_3c = 0xffff;
    uStack_3a = 0;
    local_38 = 0;
    uStack_34 = 0;
  }
  else {
    uVar1 = *(undefined8 *)(*(long *)((long)local_58.o.wp.value + 8) + 0x350);
    uVar2 = *(undefined8 *)(*(long *)((long)local_58.o.wp.value + 8) + 0x358);
    local_40 = (undefined4)uVar1;
    uStack_3c = (undefined2)((ulong)uVar1 >> 0x20);
    uStack_3a = (undefined2)((ulong)uVar1 >> 0x30);
    local_38 = (undefined4)uVar2;
    uStack_34 = (undefined2)((ulong)uVar2 >> 0x20);
  }
  QAutoPointer<QColorDialog>::~QAutoPointer(&local_58);
  QVar3.ct.argb.alpha = uStack_3c;
  QVar3.cspec = local_40;
  QVar3.ct.argb.red = uStack_3a;
  QVar3.ct._4_4_ = local_38;
  QVar3.ct.argb.pad = uStack_34;
  QVar3._14_2_ = uStack_32;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialog::getColor(const QColor &initial, QWidget *parent, const QString &title,
                              ColorDialogOptions options)
{
    QAutoPointer<QColorDialog> dlg(new QColorDialog(parent));
    if (!title.isEmpty())
        dlg->setWindowTitle(title);
    dlg->setOptions(options);
    dlg->setCurrentColor(initial);

    // If the dlg was deleted with a parent window,
    // dlg == nullptr after leaving the exec().
    dlg->exec();
    if (bool(dlg))
        return dlg->selectedColor();
    else
        return QColor();
}